

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

void __thiscall
testing::internal::linked_ptr_internal::join(linked_ptr_internal *this,linked_ptr_internal *ptr)

{
  linked_ptr_internal *plVar1;
  linked_ptr_internal *plVar2;
  
  MutexBase::Lock((MutexBase *)g_linked_ptr_mutex);
  plVar1 = ptr;
  do {
    plVar2 = plVar1;
    plVar1 = plVar2->next_;
  } while (plVar1 != ptr);
  plVar2->next_ = this;
  this->next_ = ptr;
  MutexBase::Unlock((MutexBase *)g_linked_ptr_mutex);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_linked_ptr_mutex) {
    MutexLock lock(&g_linked_ptr_mutex);

    linked_ptr_internal const* p = ptr;
    while (p->next_ != ptr) p = p->next_;
    p->next_ = this;
    next_ = ptr;
  }